

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.c
# Opt level: O1

double mpe(double *predicted,double *actual,int N)

{
  double dVar1;
  void *__ptr;
  ulong uVar2;
  int iVar3;
  double local_30;
  
  __ptr = malloc((long)N * 8);
  if (0 < N) {
    uVar2 = 0;
    do {
      *(double *)((long)__ptr + uVar2 * 8) =
           ((actual[uVar2] - predicted[uVar2]) * 100.0) / actual[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)N != uVar2);
  }
  if (N < 1) {
    local_30 = NAN;
  }
  else {
    local_30 = 0.0;
    uVar2 = 0;
    iVar3 = 0;
    do {
      dVar1 = *(double *)((long)__ptr + uVar2 * 8);
      if (!NAN(dVar1)) {
        local_30 = local_30 + dVar1;
      }
      iVar3 = iVar3 + (uint)!NAN(dVar1);
      uVar2 = uVar2 + 1;
    } while ((uint)N != uVar2);
    local_30 = local_30 / (double)iVar3;
  }
  free(__ptr);
  return local_30;
}

Assistant:

double mpe(double *predicted, double *actual, int N) {
    double err,temp;
    double *errvec;
    int i,j;

    errvec = (double*) malloc(sizeof(double)*N);

    pe(predicted,actual,N,errvec);
    j = 0;
    temp = 0.0;
    for(i = 0; i < N;++i) {
        if (errvec[i] == errvec[i]) {
            j++;
            temp += errvec[i];
        }
    }

    err = temp/j;

    free(errvec);
    return err;
}